

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_white_noise
          (rf_image *__return_storage_ptr__,int width,int height,float factor,rf_rand_proc rand,
          rf_allocator allocator)

{
  int iVar1;
  int iVar2;
  rf_image local_88;
  undefined8 local_70;
  long local_68;
  undefined4 local_60;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  rf_color *local_40;
  rf_color *dst;
  rf_rand_proc p_Stack_30;
  int dst_size;
  rf_rand_proc rand_local;
  int local_20;
  float factor_local;
  int height_local;
  int width_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _height_local = allocator.user_data;
  p_Stack_30 = rand;
  rand_local._4_4_ = factor;
  local_20 = height;
  factor_local = (float)width;
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = (int)factor_local * local_20;
  iVar2 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  dst._4_4_ = iVar1 * iVar2;
  if ((p_Stack_30 != (rf_rand_proc)0x0) && (0 < dst._4_4_)) {
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_50 = "rf_gen_image_white_noise";
    local_48 = 0x4282;
    local_70 = 0;
    local_68 = (long)dst._4_4_;
    local_60 = 0;
    local_40 = (rf_color *)(*(code *)allocator_local.user_data)(&height_local,1);
    rf_gen_image_white_noise_to_buffer
              (&local_88,(int)factor_local,local_20,rand_local._4_4_,p_Stack_30,local_40,
               (long)dst._4_4_);
    __return_storage_ptr__->data = local_88.data;
    __return_storage_ptr__->width = local_88.width;
    __return_storage_ptr__->height = local_88.height;
    __return_storage_ptr__->format = local_88.format;
    __return_storage_ptr__->valid = local_88.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_88._21_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_white_noise(int width, int height, float factor, rf_rand_proc rand, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);

    if (!rand || dst_size <= 0) return result;

    rf_color* dst = RF_ALLOC(allocator, dst_size);
    result = rf_gen_image_white_noise_to_buffer(width, height, factor, rand, dst, dst_size);

    return result;
}